

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O1

Type * soul::ModuleCloner::cloneType
                 (Type *__return_storage_ptr__,StructMappings *structMappings,Type *t)

{
  uint32_t uVar1;
  Structure *pSVar2;
  bool bVar3;
  bool bVar4;
  Category CVar5;
  BoundedIntSize BVar6;
  mapped_type *pmVar7;
  Type *t_1;
  Type local_50;
  Structure *local_38 [2];
  StructurePtr local_28;
  
  if (t->category == array) {
    Type::getArrayElementType((Type *)local_38,t);
    cloneType(&local_50,structMappings,(Type *)local_38);
    Type::createCopyWithNewArrayElementType(__return_storage_ptr__,t,&local_50);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_50.structure.object);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_28.object);
  }
  else if (t->category == structure) {
    Type::getStruct((Type *)local_38);
    local_50._0_8_ = local_38[0];
    pmVar7 = std::__detail::
             _Map_base<const_soul::Structure_*,_std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>,_std::__detail::_Select1st,_std::equal_to<const_soul::Structure_*>,_std::hash<const_soul::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_soul::Structure_*,_std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>,_std::__detail::_Select1st,_std::equal_to<const_soul::Structure_*>,_std::hash<const_soul::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)structMappings,(key_type *)&local_50);
    pSVar2 = pmVar7->object;
    if (pSVar2 == (Structure *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x46);
    }
    uVar1 = (pSVar2->super_RefCountedObject).refCount;
    (pSVar2->super_RefCountedObject).refCount = uVar1 + 1;
    bVar3 = t->isRef;
    bVar4 = t->isConstant;
    __return_storage_ptr__->category = structure;
    __return_storage_ptr__->arrayElementCategory = invalid;
    __return_storage_ptr__->isRef = false;
    __return_storage_ptr__->isConstant = false;
    __return_storage_ptr__->primitiveType = invalid;
    __return_storage_ptr__->boundingSize = 0;
    __return_storage_ptr__->arrayElementBoundingSize = 0;
    (__return_storage_ptr__->structure).object = pSVar2;
    (pSVar2->super_RefCountedObject).refCount = uVar1 + 2;
    __return_storage_ptr__->isRef = bVar3;
    __return_storage_ptr__->isConstant = bVar4;
    RefCountedPtr<soul::Structure>::decIfNotNull(pSVar2);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_38[0]);
  }
  else {
    CVar5 = t->arrayElementCategory;
    bVar3 = t->isRef;
    bVar4 = t->isConstant;
    __return_storage_ptr__->category = t->category;
    __return_storage_ptr__->arrayElementCategory = CVar5;
    __return_storage_ptr__->isRef = bVar3;
    __return_storage_ptr__->isConstant = bVar4;
    (__return_storage_ptr__->primitiveType).type = (t->primitiveType).type;
    BVar6 = t->arrayElementBoundingSize;
    __return_storage_ptr__->boundingSize = t->boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = BVar6;
    pSVar2 = (t->structure).object;
    (__return_storage_ptr__->structure).object = pSVar2;
    if (pSVar2 != (Structure *)0x0) {
      (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Type cloneType (StructMappings& structMappings, const Type& t)
    {
        if (t.isStruct())
            return Type::createStruct (*structMappings[t.getStruct().get()])
                     .withConstAndRefFlags (t.isConst(), t.isReference());

        if (t.isArray())
            return t.createCopyWithNewArrayElementType (cloneType (structMappings, t.getArrayElementType()));

        return t;
    }